

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::StartAt
          (LocationRecorder *this,LocationRecorder *other)

{
  RepeatedField<int> *pRVar1;
  Location *pLVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  Nonnull<const_char_*> pcVar6;
  
  pLVar2 = this->location_;
  pRVar1 = &(other->location_->field_0)._impl_.span_;
  iVar3 = internal::SooRep::size
                    (&pRVar1->soo_rep_,(*(byte *)((long)&other->location_->field_0 + 0x20) & 4) == 0
                    );
  if (iVar3 < 1) {
    pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (0,(long)iVar3,"index < size()");
  }
  else {
    pcVar6 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar6 == (Nonnull<const_char_*>)0x0) {
    piVar5 = RepeatedField<int>::elements
                       (pRVar1,(undefined1  [16])
                               ((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4
                               ) == (undefined1  [16])0x0);
    iVar3 = *piVar5;
    pRVar1 = &(pLVar2->field_0)._impl_.span_;
    iVar4 = internal::SooRep::size
                      (&pRVar1->soo_rep_,(*(byte *)((long)&pLVar2->field_0 + 0x20) & 4) == 0);
    if (iVar4 < 1) {
      pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (0,(long)iVar4,"index < size()");
    }
    else {
      pcVar6 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar6 != (Nonnull<const_char_*>)0x0) goto LAB_001f9900;
    piVar5 = RepeatedField<int>::elements
                       (pRVar1,(undefined1  [16])
                               ((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4
                               ) == (undefined1  [16])0x0);
    *piVar5 = iVar3;
    pLVar2 = this->location_;
    pRVar1 = &(other->location_->field_0)._impl_.span_;
    iVar3 = internal::SooRep::size
                      (&pRVar1->soo_rep_,
                       (*(byte *)((long)&other->location_->field_0 + 0x20) & 4) == 0);
    if (iVar3 < 2) {
      pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (1,(long)iVar3,"index < size()");
    }
    else {
      pcVar6 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar6 == (Nonnull<const_char_*>)0x0) {
      piVar5 = RepeatedField<int>::elements
                         (pRVar1,(undefined1  [16])
                                 ((undefined1  [16])(pRVar1->soo_rep_).field_0 &
                                 (undefined1  [16])0x4) == (undefined1  [16])0x0);
      iVar3 = piVar5[1];
      pRVar1 = &(pLVar2->field_0)._impl_.span_;
      iVar4 = internal::SooRep::size
                        (&pRVar1->soo_rep_,(*(byte *)((long)&pLVar2->field_0 + 0x20) & 4) == 0);
      if (iVar4 < 2) {
        pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (1,(long)iVar4,"index < size()");
      }
      else {
        pcVar6 = (Nonnull<const_char_*>)0x0;
      }
      if (pcVar6 == (Nonnull<const_char_*>)0x0) {
        piVar5 = RepeatedField<int>::elements
                           (pRVar1,(undefined1  [16])
                                   ((undefined1  [16])(pRVar1->soo_rep_).field_0 &
                                   (undefined1  [16])0x4) == (undefined1  [16])0x0);
        piVar5[1] = iVar3;
        return;
      }
      goto LAB_001f9916;
    }
  }
  else {
    StartAt();
LAB_001f9900:
    StartAt();
  }
  StartAt();
LAB_001f9916:
  StartAt();
}

Assistant:

void Parser::LocationRecorder::StartAt(const LocationRecorder& other) {
  location_->set_span(0, other.location_->span(0));
  location_->set_span(1, other.location_->span(1));
}